

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::
doWalk(TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector> *this)

{
  Kind KVar1;
  Kind KVar2;
  pointer pTVar3;
  anon_union_8_2_a60233d5_for_Task_2 __x;
  TypeInfo *pTVar4;
  HeapTypeInfo *pHVar5;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __tmp;
  anon_union_8_2_a60233d5_for_Task_2 aVar6;
  __ireturn_type _Var7;
  value_type local_40;
  
LAB_00a3bb58:
  pTVar3 = (this->taskList).
           super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->taskList).
      super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start == pTVar3) {
    return;
  }
  KVar1 = pTVar3[-1].kind;
  __x = (anon_union_8_2_a60233d5_for_Task_2)pTVar3[-1].field_1.type;
  (this->taskList).
  super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = pTVar3 + -1;
  local_40.field_1 = __x;
  if (KVar1 != ScanHeapType) goto code_r0x00a3bb79;
  local_40.kind = PostHeapType;
  std::
  vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
  ::push_back(&this->taskList,&local_40);
  if (*(char *)&this[3].taskList.
                super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
                ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
    _Var7 = std::__detail::
            _Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)(this + 1),(value_type *)__x.type);
    if ((((undefined1  [16])_Var7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (0xd < (__x.heapType)->id)) {
      pHVar5 = getHeapTypeInfo((HeapType)(__x.heapType)->id);
      KVar2 = pHVar5->kind;
      if (KVar2 == ArrayKind) {
LAB_00a3bce6:
        local_40.field_1.type = (Type *)&pHVar5->field_6;
        local_40.kind = ScanType;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
        ::push_back(&this->taskList,&local_40);
      }
      else if (KVar2 == StructKind) {
        aVar6 = (anon_union_8_2_a60233d5_for_Task_2)
                (pHVar5->field_6).struct_.fields.
                super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                super__Vector_impl_data._M_finish;
        while ((pointer)aVar6.type !=
               (pHVar5->field_6).struct_.fields.
               super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_start) {
          aVar6.type = aVar6.type + -2;
          local_40.kind = ScanType;
          local_40.field_1.type = aVar6.type;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
          ::push_back(&this->taskList,&local_40);
        }
      }
      else if (KVar2 == SignatureKind) {
        local_40.field_1.type = (Type *)((long)&pHVar5->field_6 + 8);
        local_40.kind = ScanType;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
        ::push_back(&this->taskList,&local_40);
        goto LAB_00a3bce6;
      }
    }
  }
  else {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &this[3].taskList.
                super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)__x.type);
  }
  local_40.kind = PreHeapType;
  goto LAB_00a3bc9d;
code_r0x00a3bb79:
  if (KVar1 == ScanType) {
    local_40.kind = PostType;
    std::
    vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
    ::push_back(&this->taskList,&local_40);
    *(undefined1 *)
     &this[3].taskList.
      super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = 0;
    if (6 < (__x.type)->id) {
      pTVar4 = getTypeInfo((Type)(__x.type)->id);
      if (pTVar4->kind == RefKind) {
        local_40.field_1.type = (Type *)&pTVar4->field_2;
        local_40.kind = ScanHeapType;
        std::
        vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
        ::push_back(&this->taskList,&local_40);
      }
      else if (pTVar4->kind == TupleKind) {
        aVar6 = (anon_union_8_2_a60233d5_for_Task_2)
                (pTVar4->field_2).tuple.types.
                super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish;
        while (aVar6.type !=
               (pTVar4->field_2).tuple.types.
               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start) {
          aVar6.type = aVar6.type + -1;
          local_40.kind = ScanType;
          local_40.field_1.type = aVar6.type;
          std::
          vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
          ::push_back(&this->taskList,&local_40);
        }
      }
    }
    local_40.kind = PreType;
LAB_00a3bc9d:
    local_40.field_1 = __x;
    std::
    vector<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
    ::push_back(&this->taskList,&local_40);
  }
  goto LAB_00a3bb58;
}

Assistant:

void TypeGraphWalkerBase<Self>::doWalk() {
  while (!taskList.empty()) {
    auto curr = taskList.back();
    taskList.pop_back();
    switch (curr.kind) {
      case Task::PreType:
        self().preVisitType(curr.type);
        break;
      case Task::PreHeapType:
        self().preVisitHeapType(curr.heapType);
        break;
      case Task::ScanType:
        taskList.push_back(Task::postVisit(curr.type));
        self().scanType(curr.type);
        taskList.push_back(Task::preVisit(curr.type));
        break;
      case Task::ScanHeapType:
        taskList.push_back(Task::postVisit(curr.heapType));
        self().scanHeapType(curr.heapType);
        taskList.push_back(Task::preVisit(curr.heapType));
        break;
      case Task::PostType:
        self().postVisitType(curr.type);
        break;
      case Task::PostHeapType:
        self().postVisitHeapType(curr.heapType);
        break;
    }
  }
}